

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O2

bool __thiscall
ON_PlaneSurface::CreatePlaneThroughBox
          (ON_PlaneSurface *this,ON_Plane *plane,ON_BoundingBox *bbox,double padding)

{
  ON_3dPoint p;
  double dVar1;
  bool bVar2;
  double *pdVar3;
  uint index;
  double dVar4;
  double v;
  double u;
  double local_b8;
  ON_Interval vext;
  ON_Interval uext;
  double t;
  ON_3dPoint pt;
  ON_Line edge;
  
  local_b8 = padding;
  bVar2 = ON_Plane::IsValid(plane);
  if (bVar2) {
    bVar2 = ON_BoundingBox::IsValid(bbox);
    dVar1 = ON_DBL_NINF;
    dVar4 = ON_DBL_PINF;
    index = 0;
    if (bVar2) {
      ON_Interval::ON_Interval(&uext,ON_DBL_PINF,ON_DBL_NINF);
      ON_Interval::ON_Interval(&vext,dVar4,dVar1);
      for (; index != 0xc; index = index + 1) {
        ON_BoundingBox::Edge(&edge,bbox,index);
        bVar2 = ON_Intersect(&edge,&plane->plane_equation,&t);
        if (bVar2) {
          if ((0.0 <= t) && (t <= 1.0)) {
            ON_Line::PointAt(&pt,&edge,t);
            p.y = pt.y;
            p.x = pt.x;
            p.z = pt.z;
            ON_Plane::ClosestPointTo(plane,p,&u,&v);
            dVar4 = u;
            pdVar3 = ON_Interval::operator[](&uext,0);
            dVar1 = u;
            if (dVar4 < *pdVar3) {
              pdVar3 = ON_Interval::operator[](&uext,0);
              *pdVar3 = dVar1;
            }
            dVar4 = u;
            pdVar3 = ON_Interval::operator[](&uext,1);
            dVar1 = u;
            if (*pdVar3 <= dVar4 && dVar4 != *pdVar3) {
              pdVar3 = ON_Interval::operator[](&uext,1);
              *pdVar3 = dVar1;
            }
            dVar4 = v;
            pdVar3 = ON_Interval::operator[](&vext,0);
            dVar1 = v;
            if (dVar4 < *pdVar3) {
              pdVar3 = ON_Interval::operator[](&vext,0);
              *pdVar3 = dVar1;
            }
            dVar4 = v;
            pdVar3 = ON_Interval::operator[](&vext,1);
            dVar1 = v;
            if (*pdVar3 <= dVar4 && dVar4 != *pdVar3) {
              pdVar3 = ON_Interval::operator[](&vext,1);
              *pdVar3 = dVar1;
            }
          }
        }
        ON_Line::~ON_Line(&edge);
      }
      operator=(this,plane);
      dVar4 = ON_Interval::Length(&uext);
      ON_Interval::Expand(&uext,dVar4 * local_b8 + local_b8);
      dVar4 = ON_Interval::Length(&vext);
      ON_Interval::Expand(&vext,dVar4 * local_b8 + local_b8);
      SetExtents(this,0,uext,true);
      SetExtents(this,1,vext,true);
      index = 1;
    }
  }
  else {
    index = 0;
  }
  return SUB41(index,0);
}

Assistant:

bool ON_PlaneSurface::CreatePlaneThroughBox(
  const ON_Plane& plane,
  const ON_BoundingBox& bbox,
  double padding
)
{
  if (!plane.IsValid() || !bbox.IsValid())
    return false;

  ON_Interval uext(ON_DBL_PINF, ON_DBL_NINF);
  ON_Interval vext(ON_DBL_PINF, ON_DBL_NINF);
  double t, u, v;
  for (int i = 0; i < 12; i++)
  {
    ON_Line edge = bbox.Edge(i);
    if (!ON_Intersect(edge, plane.plane_equation, &t)) continue;
    if (t < 0.0 || t > 1.0) continue;
    ON_3dPoint pt = edge.PointAt(t);
    plane.ClosestPointTo(pt, &u, &v);
    if (u < uext[0]) uext[0] = u;
    if (u > uext[1]) uext[1] = u;
    if (v < vext[0]) vext[0] = v;
    if (v > vext[1]) vext[1] = v;
  }
  *this = plane;
  uext.Expand(padding * uext.Length() + padding);
  vext.Expand(padding * vext.Length() + padding);
  SetExtents(0, uext, true);
  SetExtents(1, vext, true);
  return true;
}